

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.c
# Opt level: O0

_Bool memory_region_access_valid_ppc64
                (uc_struct_conflict11 *uc,MemoryRegion *mr,hwaddr addr,uint size,_Bool is_write,
                MemTxAttrs attrs)

{
  _Bool _Var1;
  MemTxAttrs in_stack_ffffffffffffffc8;
  _Bool is_write_local;
  uint size_local;
  hwaddr addr_local;
  MemoryRegion *mr_local;
  uc_struct_conflict11 *uc_local;
  MemTxAttrs attrs_local;
  
  if (((mr->ops->valid).accepts !=
       (_func__Bool_uc_struct_ptr_void_ptr_hwaddr_uint__Bool_MemTxAttrs_conflict15 *)0x0) &&
     (_Var1 = (*(mr->ops->valid).accepts)
                        ((uc_struct_conflict15 *)uc,mr->opaque,addr,size,is_write,
                         in_stack_ffffffffffffffc8), !_Var1)) {
    return false;
  }
  if ((((mr->ops->valid).unaligned & 1U) == 0) && ((addr & size - 1) != 0)) {
    uc_local._7_1_ = false;
  }
  else if ((mr->ops->valid).max_access_size == 0) {
    uc_local._7_1_ = true;
  }
  else if (((mr->ops->valid).max_access_size < size) || (size < (mr->ops->valid).min_access_size)) {
    uc_local._7_1_ = false;
  }
  else {
    uc_local._7_1_ = true;
  }
  return uc_local._7_1_;
}

Assistant:

bool memory_region_access_valid(struct uc_struct *uc, MemoryRegion *mr,
                                hwaddr addr,
                                unsigned size,
                                bool is_write,
                                MemTxAttrs attrs)
{
    if (mr->ops->valid.accepts
        && !mr->ops->valid.accepts(uc, mr->opaque, addr, size, is_write, attrs)) {
        return false;
    }

    if (!mr->ops->valid.unaligned && (addr & (size - 1))) {
        return false;
    }

    /* Treat zero as compatibility all valid */
    if (!mr->ops->valid.max_access_size) {
        return true;
    }

    if (size > mr->ops->valid.max_access_size
        || size < mr->ops->valid.min_access_size) {
        return false;
    }
    return true;
}